

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledOutputWriteTile(ImfTiledOutputFile *out,int dx,int dy,int lx,int ly)

{
  undefined4 in_ECX;
  ImfTiledOutputFile *in_RDI;
  undefined4 in_R8D;
  exception *e;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  anon_unknown.dwarf_70604::outfile(in_RDI);
  Imf_3_4::TiledRgbaOutputFile::writeTile
            ((TiledRgbaOutputFile *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return 1;
}

Assistant:

int
ImfTiledOutputWriteTile (
    ImfTiledOutputFile* out, int dx, int dy, int lx, int ly)
{
    try
    {
        outfile (out)->writeTile (dx, dy, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}